

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

uint arg_size(uint8_t *arg_mem,char type)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  
  uVar3 = (int)CONCAT71(in_register_00000031,type) - 0x53;
  if (0x21 < uVar3) {
    return 0;
  }
  if ((0x3846b8001U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
    switch((int)type) {
    case 0x62:
      bVar1 = arg_mem[3];
      uVar5 = (uint)arg_mem[2] << 8 | (uint)arg_mem[1] << 0x10 | (uint)*arg_mem << 0x18 |
              (uint)bVar1;
      uVar3 = (uVar5 - (bVar1 & 3)) + 4;
      if ((bVar1 & 3) == 0) {
        uVar3 = uVar5;
      }
      break;
    case 99:
    case 0x66:
    case 0x69:
    case 0x6d:
    case 0x72:
      return 4;
    case 100:
    case 0x68:
    case 0x74:
      return 8;
    case 0x65:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
      return 0xffffffff;
    default:
      if (type != 0x53) {
        return 0xffffffff;
      }
    case 0x73:
      lVar4 = 0;
      do {
        lVar2 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (arg_mem[lVar2] != '\0');
      uVar3 = (uint)lVar4 + 3;
      if (-1 < lVar4) {
        uVar3 = (uint)lVar4;
      }
      uVar3 = uVar3 & 0xfffffffc;
    }
    return uVar3 + 4;
  }
  return 0;
}

Assistant:

static unsigned arg_size(const uint8_t *arg_mem, char type)
{
    if(!has_reserved(type))
        return 0;
    const uint8_t  *arg_pos=arg_mem;
    uint32_t blob_length = 0;
    switch(type)
    {
        case 'h':
        case 't':
        case 'd':
            return 8;
        case 'm':
        case 'r':
        case 'f':
        case 'c':
        case 'i':
            return 4;
        case 'S':
        case 's':
            while(*++arg_pos);
            arg_pos += 4-(arg_pos-arg_mem)%4;
            return arg_pos-arg_mem;
        case 'b':
            blob_length |= (*arg_pos++ << 24);
            blob_length |= (*arg_pos++ << 16);
            blob_length |= (*arg_pos++ << 8);
            blob_length |= (*arg_pos++);
            if(blob_length%4)
                blob_length += 4-blob_length%4;
            arg_pos += blob_length;
            return arg_pos-arg_mem;
        default:
            assert("Invalid Type");
    }
    return -1;
}